

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::DictionaryTypeHandlerBase<int>::Add
          (DictionaryTypeHandlerBase<int> *this,PropertyRecord *propertyRecord,
          PropertyAttributes attributes,bool isInitialized,bool isFixed,bool usedAsFixed,
          ScriptContext *scriptContext)

{
  Type *pTVar1;
  JavascriptLibrary *pJVar2;
  code *pcVar3;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *pPVar4;
  PropertyRecord *key;
  bool bVar5;
  PropertyId propertyId;
  undefined4 *puVar6;
  undefined7 in_register_00000011;
  DictionaryPropertyDescriptor<int> local_58;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *local_48;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord_local;
  
  propertyRecord_local._4_4_ = (uint)CONCAT71(in_register_00000011,attributes);
  local_40 = propertyRecord;
  if (0x3fffffff < (this->super_DynamicTypeHandler).slotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x17e,"(this->GetSlotCapacity() <= MaxPropertyIndexSize)",
                                "this->GetSlotCapacity() <= MaxPropertyIndexSize");
    if (!bVar5) goto LAB_00db9e99;
    *puVar6 = 0;
  }
  if ((this->super_DynamicTypeHandler).slotCapacity <= this->nextPropertyIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x17f,"(nextPropertyIndex < this->GetSlotCapacity())",
                                "nextPropertyIndex < this->GetSlotCapacity()");
    if (!bVar5) goto LAB_00db9e99;
    *puVar6 = 0;
  }
  local_58.Data = this->nextPropertyIndex;
  if (SCARRY4(local_58.Data,1)) {
    ::Math::DefaultOverflowPolicy();
  }
  this->nextPropertyIndex = local_58.Data + 1;
  local_58.flags = PreventFalseReference;
  local_58.Attributes = (PropertyAttributes)propertyRecord_local._4_4_;
  local_58.Getter = -1;
  local_58.Setter = -1;
  if ((isFixed || usedAsFixed) &&
     (((uint)local_40->pid < 0x10 ||
      ((this->singletonInstance).ptr == (RecyclerWeakReference<Js::DynamicObject> *)0x0)))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x184,
                                "((!isFixed && !usedAsFixed) || (!IsInternalPropertyId(propertyRecord->GetPropertyId()) && this->singletonInstance != nullptr))"
                                ,
                                "(!isFixed && !usedAsFixed) || (!IsInternalPropertyId(propertyRecord->GetPropertyId()) && this->singletonInstance != nullptr)"
                               );
    if (!bVar5) {
LAB_00db9e99:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  local_58.flags =
       usedAsFixed << 6 | isFixed << 5 | isInitialized << 3 |
       local_58.flags & ~(UsedAsFixed|IsFixed|IsInitialized);
  JsUtil::
  BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
            ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)(this->propertyMap).ptr,&local_40,&local_58);
  pJVar2 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  Memory::Recycler::WBSetBit((char *)&local_48);
  local_48 = (PrototypeChainCache<Js::NoSpecialPropertyCache> *)
             &pJVar2->typesWithOnlyWritablePropertyProtoChain;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_48);
  key = local_40;
  pPVar4 = local_48;
  if ((propertyRecord_local._4_4_ & 4) == 0) {
    DynamicTypeHandler::SetHasOnlyWritableDataProperties(&this->super_DynamicTypeHandler,false);
    if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
      propertyId = DynamicTypeHandler::TMapKey_GetPropertyId(scriptContext,key);
      ScriptContext::InvalidateStoreFieldCaches(scriptContext,propertyId);
      PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
                ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)pPVar4);
    }
  }
  pJVar2 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  Memory::Recycler::WBSetBit((char *)&local_48);
  local_48 = &pJVar2->typesWithNoSpecialPropertyProtoChain;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_48);
  pPVar4 = local_48;
  bVar5 = NoSpecialPropertyCache::IsSpecialProperty(local_40);
  if ((bVar5) &&
     (pTVar1 = &(this->super_DynamicTypeHandler).propertyTypes, *pTVar1 = *pTVar1 | 0x80,
     ((this->super_DynamicTypeHandler).flags & 0x20) != 0)) {
    PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear(pPVar4);
  }
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::Add(
        const PropertyRecord* propertyRecord,
        PropertyAttributes attributes,
        bool isInitialized, bool isFixed, bool usedAsFixed,
        ScriptContext *const scriptContext)
    {
        Assert(this->GetSlotCapacity() <= MaxPropertyIndexSize);   // slotCapacity should never exceed MaxPropertyIndexSize
        Assert(nextPropertyIndex < this->GetSlotCapacity());       // nextPropertyIndex must be ready
        T index = ::Math::PostInc(nextPropertyIndex);

        DictionaryPropertyDescriptor<T> descriptor(index, attributes);
#if ENABLE_FIXED_FIELDS
        Assert((!isFixed && !usedAsFixed) || (!IsInternalPropertyId(propertyRecord->GetPropertyId()) && this->singletonInstance != nullptr));
        descriptor.SetIsInitialized(isInitialized);
        descriptor.SetIsFixed(isFixed);
        descriptor.SetUsedAsFixed(usedAsFixed);
#endif
        propertyMap->Add(propertyRecord, descriptor);

        scriptContext->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, attributes, propertyRecord, scriptContext);
        scriptContext->GetLibrary()->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(this, attributes, propertyRecord, scriptContext);
    }